

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O1

void __thiscall
vkt::Draw::anon_unknown_0::DrawTestInstanceBase::~DrawTestInstanceBase(DrawTestInstanceBase *this)

{
  deInt32 *pdVar1;
  DeviceInterface *pDVar2;
  VkCommandPool obj;
  SharedPtrStateBase *pSVar3;
  VkFramebuffer obj_00;
  VkRenderPass obj_01;
  VkImageView obj_02;
  VkPipelineLayout obj_03;
  VkPipeline obj_04;
  pointer pPVar4;
  
  (this->super_TestInstance)._vptr_TestInstance = (_func_int **)&PTR___cxa_pure_virtual_00d2ba30;
  if ((this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object !=
      (VkCommandBuffer_s *)0x0) {
    pDVar2 = (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface
    ;
    (*pDVar2->_vptr_DeviceInterface[0x48])
              (pDVar2,(this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                      m_device,
               (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
               m_internal,1);
  }
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device = (VkDevice)0x0
  ;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal = 0;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       (VkCommandBuffer_s *)0x0;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  obj.m_internal =
       (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&(this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,obj)
    ;
  }
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  pSVar3 = (this->m_vertexBuffer).m_state;
  if (pSVar3 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSVar3->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (this->m_vertexBuffer).m_ptr = (Buffer *)0x0;
      (*((this->m_vertexBuffer).m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &((this->m_vertexBuffer).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      pSVar3 = (this->m_vertexBuffer).m_state;
      if (pSVar3 != (SharedPtrStateBase *)0x0) {
        (*pSVar3->_vptr_SharedPtrStateBase[1])();
      }
      (this->m_vertexBuffer).m_state = (SharedPtrStateBase *)0x0;
    }
  }
  obj_00.m_internal =
       (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal
  ;
  if (obj_00.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&(this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter,
               obj_00);
  }
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal = 0;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  obj_01.m_internal =
       (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  if (obj_01.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
               obj_01);
  }
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal = 0;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  obj_02.m_internal =
       (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
       m_internal;
  if (obj_02.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&(this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.
                deleter,obj_02);
  }
  (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
       = 0;
  (this->m_colorTargetView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  pSVar3 = (this->m_colorTargetImage).m_state;
  if (pSVar3 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &pSVar3->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (this->m_colorTargetImage).m_ptr = (Image *)0x0;
      (*((this->m_colorTargetImage).m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &((this->m_colorTargetImage).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      pSVar3 = (this->m_colorTargetImage).m_state;
      if (pSVar3 != (SharedPtrStateBase *)0x0) {
        (*pSVar3->_vptr_SharedPtrStateBase[1])();
      }
      (this->m_colorTargetImage).m_state = (SharedPtrStateBase *)0x0;
    }
  }
  obj_03.m_internal =
       (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
       m_internal;
  if (obj_03.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                deleter,obj_03);
  }
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)0x0;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal =
       0;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  obj_04.m_internal =
       (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  if (obj_04.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&(this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               obj_04);
  }
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  pPVar4 = (this->m_data).vertices.
           super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pPVar4 != (pointer)0x0) {
    operator_delete(pPVar4,(long)(this->m_data).vertices.
                                 super__Vector_base<vkt::Draw::PositionColorVertex,_std::allocator<vkt::Draw::PositionColorVertex>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pPVar4);
  }
  return;
}

Assistant:

DrawTestInstanceBase::~DrawTestInstanceBase (void)
{
}